

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SpinGroup::SpinGroup
          (SpinGroup *this,ResonanceChannels *channels,ResonanceParameters *parameters)

{
  BackgroundChannels local_50;
  vector<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BackgroundChannels::BackgroundChannels
            (&local_50,
             (uint)(((long)(channels->super_ListRecord).data.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(channels->super_ListRecord).data.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) / 6),&local_38);
  SpinGroup(this,channels,parameters,&local_50);
  std::
  vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
  ::~vector(&local_50.channels_);
  std::
  vector<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

SpinGroup( ResonanceChannels&& channels, ResonanceParameters&& parameters )
  try : SpinGroup( std::move( channels ), std::move( parameters ),
                   BackgroundChannels( channels.NCH(), {} ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing a spin group" );
    throw;
  }